

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depfile_shared.h
# Opt level: O0

QString * escapeDependencyPath<QString>(QString *path)

{
  bool bVar1;
  int iVar2;
  qsizetype qVar3;
  QString *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  int backwards_it;
  int i;
  int size;
  QString *escapedPath;
  QChar *in_stack_ffffffffffffff88;
  uint7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  undefined1 uVar4;
  QString *this;
  int local_50;
  int local_4c;
  uint3 in_stack_ffffffffffffffbc;
  uint uVar5;
  QLatin1Char local_2f [4];
  QLatin1Char local_2b [3];
  char16_t local_28;
  QLatin1Char local_25 [4];
  QLatin1Char local_21 [3];
  char16_t local_1e;
  QLatin1Char local_1b [4];
  QLatin1Char local_17 [3];
  char16_t local_14;
  QLatin1Char local_11 [4];
  QLatin1Char local_d [3];
  char16_t local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = (uint)in_stack_ffffffffffffffbc;
  (in_RDI->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).size = -0x5555555555555556;
  this = in_RDI;
  QString::QString((QString *)0x154ac7);
  qVar3 = QString::size(in_RSI);
  iVar2 = (int)qVar3;
  QString::reserve(this,CONCAT44(uVar5,iVar2));
  for (local_4c = 0; local_4c < iVar2; local_4c = local_4c + 1) {
    local_a = (char16_t)
              QString::operator[](in_RDI,CONCAT17(in_stack_ffffffffffffff97,
                                                  in_stack_ffffffffffffff90));
    QLatin1Char::QLatin1Char(local_d,'$');
    QChar::QChar<QLatin1Char,_true>
              ((QChar *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
               (QLatin1Char)(char)((ulong)in_RDI >> 0x38));
    bVar1 = operator==((QChar *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                       in_stack_ffffffffffffff88);
    if (bVar1) {
      QLatin1Char::QLatin1Char(local_11,'$');
      QChar::QChar<QLatin1Char,_true>
                ((QChar *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                 (QLatin1Char)(char)((ulong)in_RDI >> 0x38));
      QString::append((QChar)(char16_t)this);
    }
    else {
      local_14 = (char16_t)
                 QString::operator[](in_RDI,CONCAT17(in_stack_ffffffffffffff97,
                                                     in_stack_ffffffffffffff90));
      QLatin1Char::QLatin1Char(local_17,'#');
      QChar::QChar<QLatin1Char,_true>
                ((QChar *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                 (QLatin1Char)(char)((ulong)in_RDI >> 0x38));
      bVar1 = operator==((QChar *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                         in_stack_ffffffffffffff88);
      if (bVar1) {
        QLatin1Char::QLatin1Char(local_1b,'\\');
        QChar::QChar<QLatin1Char,_true>
                  ((QChar *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                   (QLatin1Char)(char)((ulong)in_RDI >> 0x38));
        QString::append((QChar)(char16_t)this);
      }
      else {
        local_1e = (char16_t)
                   QString::operator[](in_RDI,CONCAT17(in_stack_ffffffffffffff97,
                                                       in_stack_ffffffffffffff90));
        QLatin1Char::QLatin1Char(local_21,' ');
        QChar::QChar<QLatin1Char,_true>
                  ((QChar *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                   (QLatin1Char)(char)((ulong)in_RDI >> 0x38));
        bVar1 = operator==((QChar *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                           in_stack_ffffffffffffff88);
        if (bVar1) {
          QLatin1Char::QLatin1Char(local_25,'\\');
          QChar::QChar<QLatin1Char,_true>
                    ((QChar *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                     (QLatin1Char)(char)((ulong)in_RDI >> 0x38));
          QString::append((QChar)(char16_t)this);
          local_50 = local_4c;
          while( true ) {
            local_50 = local_50 + -1;
            uVar4 = false;
            if (0 < local_50) {
              local_28 = (char16_t)QString::operator[](in_RDI,(ulong)in_stack_ffffffffffffff90);
              QLatin1Char::QLatin1Char(local_2b,'\\');
              QChar::QChar<QLatin1Char,_true>
                        ((QChar *)CONCAT17(uVar4,in_stack_ffffffffffffff90),
                         (QLatin1Char)(char)((ulong)in_RDI >> 0x38));
              uVar4 = operator==((QChar *)CONCAT17(uVar4,in_stack_ffffffffffffff90),
                                 in_stack_ffffffffffffff88);
            }
            if ((bool)uVar4 == false) break;
            QLatin1Char::QLatin1Char(local_2f,'\\');
            QChar::QChar<QLatin1Char,_true>
                      ((QChar *)CONCAT17(uVar4,in_stack_ffffffffffffff90),
                       (QLatin1Char)(char)((ulong)in_RDI >> 0x38));
            QString::append((QChar)(char16_t)this);
          }
          in_stack_ffffffffffffff97 = 0;
        }
      }
    }
    QString::operator[](in_RDI,CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
    QString::append((QChar)(char16_t)this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

StringType escapeDependencyPath(const StringType &path)
{
    using CT = typename CharType<StringType>::type;
    StringType escapedPath;
    int size = path.size();
    escapedPath.reserve(size);
    for (int i = 0; i < size; ++i) {
        if (path[i] == CT('$')) {
            escapedPath.append(CT('$'));
        } else if (path[i] == CT('#')) {
            escapedPath.append(CT('\\'));
        } else if (path[i] == CT(' ')) {
            escapedPath.append(CT('\\'));
            int backwards_it = i - 1;
            while (backwards_it > 0 && path[backwards_it] == CT('\\')) {
                escapedPath.append(CT('\\'));
                --backwards_it;
            }
        }
        escapedPath.append(path[i]);
    }
    return escapedPath;
}